

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpTo::writeWithFds
          (BlockedPumpTo *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData,ArrayPtr<const_int> fds)

{
  undefined8 *__buf;
  long in_R9;
  ArrayPtr<const_unsigned_char> *ptrCopy;
  size_t sizeCopy;
  size_t __n;
  int __fd;
  
  __fd = (int)data.ptr;
  if (in_R9 == 0) {
    write(this,__fd,(void *)data.size_,(size_t)moreData.ptr);
  }
  else {
    __buf = (undefined8 *)
            kj::_::HeapArrayDisposer::allocateImpl
                      (0x10,0,in_R9 + 1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    *__buf = (void *)data.size_;
    __buf[1] = moreData.ptr;
    memcpy(__buf + 2,(void *)moreData.size_,in_R9 * 0x10);
    __n = (long)(in_R9 * 0x10 + 0x10U) >> 4;
    write(this,__fd,__buf,__n);
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,__buf,0x10,__n,__n,
               (_func_void_void_ptr *)0x0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> writeWithFds(ArrayPtr<const byte> data,
                               ArrayPtr<const ArrayPtr<const byte>> moreData,
                               ArrayPtr<const int> fds) override {
      // Pumps drop all capabilities, so fall back to regular write().

      // TODO(cleaunp): After stream API refactor, regular write() methods will take
      //   (data, moreData) and we can clean this up.
      if (moreData.size() == 0) {
        return write(data);
      } else {
        auto pieces = kj::heapArrayBuilder<const ArrayPtr<const byte>>(moreData.size() + 1);
        pieces.add(data);
        pieces.addAll(moreData);
        return write(pieces.finish());
      }
    }